

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O3

bid_t docio_append_doc_raw(docio_handle *handle,uint64_t size,void *buf)

{
  ushort uVar1;
  filemgr_magic_t magic;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  fdb_status fVar5;
  uint64_t uVar6;
  bid_t bVar7;
  bid_t bVar8;
  bid_t bVar9;
  ulong uVar10;
  uint uVar11;
  uint64_t len;
  ulong uVar12;
  bid_t bVar13;
  undefined1 *puVar14;
  undefined8 *puVar15;
  ulong *puVar16;
  undefined8 *puVar17;
  long lVar18;
  filemgr *pfVar19;
  err_log_callback *peVar20;
  undefined1 *puVar21;
  size_t sVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  uint uVar27;
  ulong uVar28;
  void *pvVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  ulong uStack_f8;
  bid_t bStack_f0;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  bid_t local_c0;
  bid_t end;
  uint64_t local_b0;
  ulong local_a8;
  ulong local_a0;
  undefined1 local_98 [15];
  undefined1 uStack_89;
  bid_t local_88;
  bid_t begin;
  void *local_78;
  bid_t local_70;
  uint64_t local_68;
  ulong *local_60;
  ulong local_58;
  err_log_callback *local_50;
  ulong local_48;
  ulong local_40;
  undefined1 local_32;
  char local_31;
  uint8_t marker [1];
  long lVar33;
  
  peVar20 = handle->log_callback;
  uVar12 = (ulong)handle->file->blocksize;
  uStack_e0 = 0x11ec2d;
  local_31 = ver_non_consecutive_doc(handle->file->version);
  local_b0 = uVar12 - 0x10;
  begin = uVar12 - 1;
  uVar24 = begin;
  if ((bool)local_31) {
    uVar24 = local_b0;
  }
  local_98 = SUB1615((undefined1  [16])0x0,0);
  uStack_89 = 0xdd;
  local_32 = 0xdd;
  bVar7 = handle->curblock;
  local_40 = uVar12;
  if (bVar7 == 0xffffffffffffffff) {
    uStack_e0 = 0x11ec75;
    uVar6 = filemgr_get_sb_bmp_revnum(handle->file);
    handle->cur_bmp_revnum_hash = (uint16_t)uVar6;
    uStack_e0 = 0x11ec84;
    bVar7 = filemgr_alloc(handle->file,peVar20);
    handle->curblock = bVar7;
    handle->curpos = 0;
  }
  uStack_e0 = 0x11ec9a;
  iVar4 = filemgr_is_writable(handle->file,bVar7);
  uVar11 = handle->curpos;
  local_68 = size;
  local_78 = buf;
  if (iVar4 == 0) {
    if (uVar11 < (uint)local_40) {
      uStack_e0 = 0x11ecca;
      filemgr_mark_stale(handle->file,handle->curblock * local_40 + (ulong)uVar11,uVar24 - uVar11);
    }
    uStack_e0 = 0x11ecd2;
    uVar6 = filemgr_get_sb_bmp_revnum(handle->file);
    handle->cur_bmp_revnum_hash = (uint16_t)uVar6;
    uStack_e0 = 0x11ece1;
    bVar7 = filemgr_alloc(handle->file,peVar20);
    handle->curblock = bVar7;
    handle->curpos = 0;
    uVar11 = 0;
  }
  uVar6 = local_68;
  local_98._8_2_ = handle->cur_bmp_revnum_hash << 8 | handle->cur_bmp_revnum_hash >> 8;
  uVar12 = (ulong)uVar11;
  if (uVar24 - uVar12 < local_68) {
    local_50 = peVar20;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar24;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_68;
    local_58 = SUB168(auVar34 / auVar3,0);
    uVar12 = local_68 % uVar24;
    iVar4 = SUB164(auVar34 / auVar3,0);
    local_60 = (ulong *)(local_d8 + -((ulong)(iVar4 + 1) * 8 + 0xf & 0xfffffffffffffff0));
    bVar7 = (long)(local_d8 + -((ulong)(iVar4 + 1) * 8 + 0xf & 0xfffffffffffffff0)) -
            ((ulong)(iVar4 + 1) * 2 + 0xf & 0xfffffffffffffff0);
    end = bVar7;
    uVar11 = (int)uVar24 - uVar11;
    local_a8 = uVar24;
    local_48 = (ulong)uVar11;
    uVar27 = (uint)uVar12;
    if (local_31 == '\0') {
      pfVar19 = handle->file;
      bVar8 = handle->curblock;
      *(undefined8 *)(bVar7 - 8) = 0x11ee6f;
      bVar9 = filemgr_alloc_multiple_cond
                        (pfVar19,bVar8 + 1,iVar4 + (uint)(uVar11 < uVar27),&local_88,&local_c0,
                         peVar20);
      uVar12 = local_40;
      peVar20 = local_50;
      bVar13 = begin;
      bVar8 = handle->curblock;
      if (bVar9 == bVar8 + 1) {
        pfVar19 = handle->file;
        if (local_88 != bVar9) {
          sVar22 = 0x161;
          fVar5 = FDB_RESULT_SUCCESS;
          *(char **)(bVar7 - 0x10) = pfVar19->filename;
          *(bid_t *)(bVar7 - 0x18) = bVar9;
          puVar15 = (undefined8 *)(bVar7 - 0x20);
          *(char **)(bVar7 - 0x20) =
               "Error in allocating blocks starting from block id %lu in a database file \'%s\'";
          goto LAB_0011ef47;
        }
        *(err_log_callback **)(bVar7 - 0x10) = local_50;
        *(undefined8 *)(bVar7 - 0x18) = 0x11eeb2;
        fVar5 = filemgr_write_offset
                          (pfVar19,bVar8,bVar13,1,&local_32,false,
                           *(err_log_callback **)(bVar7 - 0x10));
        pvVar29 = local_78;
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfVar19 = handle->file;
          puVar17 = (undefined8 *)(bVar7 - 8);
          pcVar23 = 
          "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
          sVar22 = 0x16b;
          goto LAB_0011ef38;
        }
        if ((int)local_48 == 0) {
          uVar12 = 0;
        }
        else {
          pfVar19 = handle->file;
          bVar8 = handle->curblock;
          uVar11 = handle->curpos;
          uVar12 = local_48 & 0xffffffff;
          *(err_log_callback **)(bVar7 - 0x10) = peVar20;
          *(undefined8 *)(bVar7 - 0x18) = 0x11f57d;
          fVar5 = filemgr_write_offset
                            (pfVar19,bVar8,(ulong)uVar11,uVar12,pvVar29,true,
                             *(err_log_callback **)(bVar7 - 0x10));
          if (fVar5 != FDB_RESULT_SUCCESS) {
            sVar22 = 0x177;
            *(char **)(bVar7 - 0x10) = handle->file->filename;
            *(uint64_t *)(bVar7 - 0x18) = uVar6;
            puVar16 = (ulong *)(bVar7 - 0x20);
            *(ulong *)(bVar7 - 0x20) = local_48;
            goto LAB_0011efc0;
          }
        }
        uVar6 = uVar6 - uVar12;
        local_70 = (ulong)handle->curpos + local_40 * handle->curblock;
      }
      else {
        if ((bVar8 != 0xffffffffffffffff) && (uVar11 = handle->curpos, uVar11 < (uint)local_40)) {
          pfVar19 = handle->file;
          lVar18 = bVar8 * local_40;
          sVar22 = begin - uVar11;
          *(undefined8 *)(bVar7 - 8) = 0x11f002;
          filemgr_mark_stale(pfVar19,lVar18 + (ulong)uVar11,sVar22);
        }
        peVar20 = local_50;
        pfVar19 = handle->file;
        iVar4 = (int)local_58;
        *(undefined8 *)(bVar7 - 8) = 0x11f027;
        filemgr_alloc_multiple
                  (pfVar19,(iVar4 + 1) - (uint)(uVar27 == 0),&local_88,&local_c0,peVar20);
        local_48 = 0;
        local_70 = uVar12 * local_88;
      }
      auVar3 = _DAT_0014bd20;
      uVar12 = local_c0 - local_88;
      uVar10 = uVar12 + 1;
      if (uVar10 == 0) {
        return local_70;
      }
      auVar31._8_4_ = (int)uVar12;
      auVar31._0_8_ = uVar12;
      auVar31._12_4_ = (int)(uVar12 >> 0x20);
      lVar18 = 0;
      auVar31 = auVar31 ^ _DAT_0014bd20;
      auVar32 = _DAT_0014bd10;
      do {
        auVar34 = auVar32 ^ auVar3;
        if ((bool)(~(auVar34._4_4_ == auVar31._4_4_ && auVar31._0_4_ < auVar34._0_4_ ||
                    auVar31._4_4_ < auVar34._4_4_) & 1)) {
          local_60[lVar18] = local_88 + lVar18;
        }
        if ((auVar34._12_4_ != auVar31._12_4_ || auVar34._8_4_ <= auVar31._8_4_) &&
            auVar34._12_4_ <= auVar31._12_4_) {
          local_60[lVar18 + 1] = local_88 + 1 + lVar18;
        }
        lVar18 = lVar18 + 2;
        lVar33 = auVar32._8_8_;
        auVar32._0_8_ = auVar32._0_8_ + 2;
        auVar32._8_8_ = lVar33 + 2;
      } while ((uVar12 & 0xfffffffffffffffe) + 2 != lVar18);
    }
    else {
      bVar30 = uVar11 < uVar27;
      uVar10 = (ulong)(iVar4 + (uint)bVar30);
      local_58 = uVar12;
      if (iVar4 + (uint)bVar30 == 0) {
        uVar10 = 0;
        bVar26 = false;
      }
      else {
        bVar26 = false;
        uVar24 = 0;
        do {
          pfVar19 = handle->file;
          *(undefined8 *)(bVar7 - 8) = 0x11ed9d;
          uVar6 = filemgr_get_sb_bmp_revnum(pfVar19);
          peVar20 = local_50;
          *(short *)(end + uVar24 * 2) = (short)uVar6;
          pfVar19 = handle->file;
          *(undefined8 *)(bVar7 - 8) = 0x11edb5;
          bVar8 = filemgr_alloc(pfVar19,peVar20);
          local_60[uVar24] = bVar8;
          if (((uVar24 == 0) &&
              (bVar13 = handle->curblock, bVar2 = bVar13 + 1 < bVar8,
              bVar26 = (bool)(bVar26 | (bVar2 && bVar13 != 0xffffffffffffffff)),
              bVar2 && bVar13 != 0xffffffffffffffff)) && ((int)local_58 != 0)) {
            uVar10 = uVar10 + ((byte)~bVar30 & 1);
            bVar30 = true;
            bVar26 = true;
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar10);
      }
      uVar12 = local_40;
      peVar20 = local_50;
      uVar24 = local_a8;
      if (((int)local_48 == 0) || (bVar26)) {
        if ((handle->curblock != 0xffffffffffffffff) &&
           (uVar11 = handle->curpos, uVar11 < (uint)local_40)) {
          pfVar19 = handle->file;
          lVar18 = handle->curblock * local_40;
          sVar22 = local_a8 - uVar11;
          *(undefined8 *)(bVar7 - 8) = 0x11f1be;
          filemgr_mark_stale(pfVar19,lVar18 + (ulong)uVar11,sVar22);
        }
        local_48 = 0;
        local_70 = uVar12 * *local_60;
        uVar6 = local_68;
      }
      else {
        local_58 = uVar10;
        uVar12 = *local_60;
        local_98._0_8_ =
             uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
             uVar12 << 0x38;
        pfVar19 = handle->file;
        bVar8 = handle->curblock;
        *(err_log_callback **)(bVar7 - 0x10) = local_50;
        *(undefined8 *)(bVar7 - 0x18) = 0x11f149;
        fVar5 = filemgr_write_offset
                          (pfVar19,bVar8,uVar24,0x10,local_98,false,
                           *(err_log_callback **)(bVar7 - 0x10));
        uVar12 = local_48;
        pvVar29 = local_78;
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfVar19 = handle->file;
          puVar17 = (undefined8 *)(bVar7 - 8);
          pcVar23 = 
          "Error in appending a doc block metadata for a block id %lu into a database file \'%s\'";
          sVar22 = 0x135;
          goto LAB_0011ef38;
        }
        pfVar19 = handle->file;
        bVar8 = handle->curblock;
        uVar11 = handle->curpos;
        uVar25 = local_48 & 0xffffffff;
        *(err_log_callback **)(bVar7 - 0x10) = peVar20;
        *(undefined8 *)(bVar7 - 0x18) = 0x11f4cf;
        fVar5 = filemgr_write_offset
                          (pfVar19,bVar8,(ulong)uVar11,uVar25,pvVar29,true,
                           *(err_log_callback **)(bVar7 - 0x10));
        if (fVar5 != FDB_RESULT_SUCCESS) {
          sVar22 = 0x143;
          *(char **)(bVar7 - 0x10) = handle->file->filename;
          *(uint64_t *)(bVar7 - 0x18) = local_68;
          puVar16 = (ulong *)(bVar7 - 0x20);
          *(ulong *)(bVar7 - 0x20) = uVar12;
          goto LAB_0011efc0;
        }
        local_70 = (ulong)handle->curpos + local_40 * handle->curblock;
        uVar10 = local_58;
        local_48 = uVar12;
        uVar6 = local_68 - uVar25;
      }
    }
    if (uVar10 != 0) {
      local_a0 = uVar10 - 1;
      uVar12 = 0;
      local_58 = uVar10;
      do {
        bVar8 = local_60[uVar12];
        handle->curblock = bVar8;
        uVar1 = *(ushort *)(end + uVar12 * 2);
        handle->cur_bmp_revnum_hash = uVar1;
        local_98._8_2_ = uVar1 << 8 | uVar1 >> 8;
        local_40 = bVar8;
        if (local_31 == '\0') {
          pfVar19 = handle->file;
          len = 1;
          puVar21 = &local_32;
          bVar13 = begin;
        }
        else {
          uVar10 = 0xffffffffffffffff;
          if (uVar12 < local_a0) {
            uVar10 = local_60[uVar12 + 1];
            uVar10 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                     (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                     (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                     (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
          }
          local_98._0_8_ = uVar10;
          pfVar19 = handle->file;
          len = 0x10;
          puVar21 = local_98;
          bVar13 = local_b0;
        }
        *(err_log_callback **)(bVar7 - 0x10) = peVar20;
        *(undefined8 *)(bVar7 - 0x18) = 0x11f278;
        fVar5 = filemgr_write_offset
                          (pfVar19,bVar8,bVar13,len,puVar21,false,
                           *(err_log_callback **)(bVar7 - 0x10));
        uVar25 = local_40;
        uVar10 = local_a0;
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pcVar23 = 
          "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
          sVar22 = 0x1b3;
          *(char **)(bVar7 - 0x10) = handle->file->filename;
LAB_0011f61c:
          puVar14 = (undefined1 *)(bVar7 - 0x18);
          *(ulong *)(bVar7 - 0x18) = local_40;
          goto LAB_0011ef45;
        }
        local_68 = uVar6;
        uVar28 = local_48 & 0xffffffff;
        bVar30 = uVar6 < uVar24;
        uVar6 = uVar6 - uVar24;
        if (bVar30) {
          if (local_a0 != uVar12) {
            *(undefined8 *)(bVar7 - 8) = 0x11f2c3;
            fdb_assert_die("i==block_list_size-1",
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                           ,0x1cb,uVar12,uVar10);
          }
          uVar24 = local_40;
          peVar20 = local_50;
          uVar6 = local_68;
          pfVar19 = handle->file;
          pvVar29 = (void *)(uVar28 + (long)local_78);
          *(err_log_callback **)(bVar7 - 0x10) = local_50;
          *(undefined8 *)(bVar7 - 0x18) = 0x11f2ec;
          fVar5 = filemgr_write_offset
                            (pfVar19,uVar24,0,uVar6,pvVar29,false,
                             *(err_log_callback **)(bVar7 - 0x10));
          uVar24 = uVar6;
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfVar19 = handle->file;
            pcVar23 = "Error in writing a doc block with id %lu, size %lu to a database file \'%s\'"
            ;
            sVar22 = 0x1d5;
LAB_0011f613:
            *(char **)(bVar7 - 8) = pfVar19->filename;
            *(ulong *)(bVar7 - 0x10) = uVar24;
            goto LAB_0011f61c;
          }
          handle->curpos = (uint32_t)uVar6;
          uVar11 = handle->file->blocksize;
          magic = handle->file->version;
          *(undefined8 *)(bVar7 - 8) = 0x11f312;
          bVar30 = ver_non_consecutive_doc(magic);
          uVar10 = local_40;
          if (((ulong)(bVar30 - 1) | 0xfffffffffffffff0) + (ulong)uVar11 <
              (uVar6 & 0xffffffff) + 0x10) goto LAB_0011f361;
          local_d8 = (undefined1  [16])0x0;
          pfVar19 = handle->file;
          *(err_log_callback **)(bVar7 - 0x10) = handle->log_callback;
          *(undefined8 *)(bVar7 - 0x18) = 0x11f3a0;
          fVar5 = filemgr_write_offset
                            (pfVar19,uVar10,uVar6 & 0xffffffff,0x10,local_d8,false,
                             *(err_log_callback **)(bVar7 - 0x10));
          iVar4 = (int)local_48;
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011efce;
        }
        else {
          pfVar19 = handle->file;
          pvVar29 = (void *)(uVar28 + (long)local_78);
          *(err_log_callback **)(bVar7 - 0x10) = local_50;
          *(undefined8 *)(bVar7 - 0x18) = 0x11f351;
          fVar5 = filemgr_write_offset
                            (pfVar19,uVar25,0,uVar24,pvVar29,true,
                             *(err_log_callback **)(bVar7 - 0x10));
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfVar19 = handle->file;
            pcVar23 = 
            "Error in writing an entire doc block with id %lu, size %lu to a database file \'%s\'";
            sVar22 = 0x1c2;
            peVar20 = local_50;
            goto LAB_0011f613;
          }
          handle->curpos = (uint32_t)uVar24;
LAB_0011f361:
          iVar4 = (int)local_48;
        }
        local_48 = (ulong)(uint)(iVar4 + (int)uVar24);
        uVar12 = uVar12 + 1;
        peVar20 = local_50;
        uVar24 = local_a8;
      } while (local_58 != uVar12);
    }
  }
  else {
    if (local_31 == '\0') {
      pfVar19 = handle->file;
      bVar7 = handle->curblock;
      puVar21 = &local_32;
      uVar6 = 1;
      bVar8 = begin;
    }
    else {
      puVar21 = local_98;
      local_98._0_8_ = 0xffffffffffffffff;
      pfVar19 = handle->file;
      bVar7 = handle->curblock;
      uVar6 = 0x10;
      bVar8 = local_b0;
    }
    bStack_f0 = 0x11ef09;
    fVar5 = filemgr_write_offset(pfVar19,bVar7,bVar8,uVar6,puVar21,false,peVar20);
    uVar6 = local_68;
    if (fVar5 == FDB_RESULT_SUCCESS) {
      bStack_f0 = 0x11ef7f;
      fVar5 = filemgr_write_offset
                        (handle->file,handle->curblock,uVar12,local_68,local_78,
                         uVar24 - uVar12 == local_68,peVar20);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        uVar27 = (int)uVar6 + handle->curpos;
        handle->curpos = uVar27;
        bVar7 = handle->curblock;
        uVar11 = handle->file->blocksize;
        uStack_e0 = 0x11f400;
        bVar30 = ver_non_consecutive_doc(handle->file->version);
        if ((ulong)uVar27 + 0x10 <= ((ulong)(bVar30 - 1) | 0xfffffffffffffff0) + (ulong)uVar11) {
          local_d8 = (undefined1  [16])0x0;
          bStack_f0 = 0x11f442;
          fVar5 = filemgr_write_offset
                            (handle->file,bVar7,(ulong)uVar27,0x10,local_d8,false,
                             handle->log_callback);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            return 0xffffffffffffffff;
          }
        }
        return local_40 * handle->curblock + uVar12;
      }
      sVar22 = 0xb5;
      bStack_f0 = uVar6;
      puVar16 = &uStack_f8;
      uStack_f8 = uVar12;
LAB_0011efc0:
      *(bid_t *)((long)puVar16 + -8) = handle->curblock;
      *(char **)((long)puVar16 + -0x10) =
           "Error in writing a doc block with id %lu, offset %d, size %lu to a database file \'%s\'"
      ;
      *(undefined8 *)((long)puVar16 + -0x18) = 0x11efca;
      fdb_log_impl(peVar20,2,fVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"docio_append_doc_raw",sVar22,*(char **)((long)puVar16 + -0x10));
    }
    else {
      pfVar19 = handle->file;
      puVar17 = &uStack_e0;
      pcVar23 = 
      "Error in appending a doc block marker for a block id %lu into a database file \'%s\'";
      sVar22 = 0xac;
LAB_0011ef38:
      *(char **)((long)puVar17 + -8) = pfVar19->filename;
      puVar14 = (undefined1 *)((long)puVar17 + -0x10);
      *(bid_t *)((long)puVar17 + -0x10) = handle->curblock;
LAB_0011ef45:
      puVar15 = (undefined8 *)(puVar14 + -8);
      *(char **)(puVar14 + -8) = pcVar23;
LAB_0011ef47:
      puVar15[-1] = 0x11ef4c;
      fdb_log_impl(peVar20,2,fVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                   ,"docio_append_doc_raw",sVar22,(char *)*puVar15);
    }
LAB_0011efce:
    local_70 = 0xffffffffffffffff;
  }
  return local_70;
}

Assistant:

bid_t docio_append_doc_raw(struct docio_handle *handle, uint64_t size, void *buf)
{
    uint32_t offset;
    uint8_t marker[BLK_MARKER_SIZE];
    size_t blocksize = handle->file->blocksize;
    size_t real_blocksize = blocksize;
    size_t remaining_space;
    err_log_callback *log_callback = handle->log_callback;
    bool non_consecutive = ver_non_consecutive_doc(handle->file->version);
    struct docblk_meta blk_meta;

    memset(&blk_meta, 0x0, sizeof(blk_meta));
    blk_meta.marker = BLK_MARKER_DOC;
    (void)blk_meta;

#ifdef __CRC32
    if (non_consecutive) {
        // new version: support non-consecutive document block
        blocksize -= DOCBLK_META_SIZE;
    } else {
        // old version: block marker only
        blocksize -= BLK_MARKER_SIZE;
    }
    memset(marker, BLK_MARKER_DOC, BLK_MARKER_SIZE);
#endif

    if (handle->curblock == BLK_NOT_FOUND) {
        // allocate new block
        handle->cur_bmp_revnum_hash =
            filemgr_get_sb_bmp_revnum(handle->file) & BMP_REVNUM_MASK;
        handle->curblock = filemgr_alloc(handle->file, log_callback);
        handle->curpos = 0;
    }
    if (!filemgr_is_writable(handle->file, handle->curblock)) {
        // mark remaining space in old block as stale
        if (handle->curpos < real_blocksize) {
            // this function will calculate block marker size automatically.
            filemgr_mark_stale(handle->file,
                               real_blocksize * handle->curblock + handle->curpos,
                               blocksize - handle->curpos);
        }
        // allocate new block
        handle->cur_bmp_revnum_hash =
            filemgr_get_sb_bmp_revnum(handle->file) & BMP_REVNUM_MASK;
        handle->curblock = filemgr_alloc(handle->file, log_callback);
        handle->curpos = 0;
    }
    blk_meta.sb_bmp_revnum_hash = _endian_encode(handle->cur_bmp_revnum_hash);

    remaining_space = blocksize - handle->curpos;
    if (size <= remaining_space) {
        fdb_status fs = FDB_RESULT_SUCCESS;
        // simply append to current block
        offset = handle->curpos;

        if (non_consecutive) {
            // set next BID
            blk_meta.next_bid = BLK_NOT_FOUND;
            // write meta
            fs = filemgr_write_offset(handle->file, handle->curblock,
                                      blocksize, sizeof(blk_meta), &blk_meta,
                                      false, log_callback);
        } else {
            fs = _add_blk_marker(handle->file, handle->curblock, blocksize, marker,
                                 log_callback);
        }


        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Error in appending a doc block marker for a block id %" _F64
                    " into a database file '%s'", handle->curblock,
                    handle->file->filename);
            return BLK_NOT_FOUND;
        }
        fs = filemgr_write_offset(handle->file, handle->curblock, offset, size,
                                  buf, (size == remaining_space), log_callback);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Error in writing a doc block with id %" _F64 ", offset %d, size %"
                    _F64 " to a database file '%s'", handle->curblock, offset, size,
                    handle->file->filename);
            return BLK_NOT_FOUND;
        }
        handle->curpos += size;

        if (_docio_fill_zero(handle, handle->curblock, handle->curpos) !=
            FDB_RESULT_SUCCESS) {
            return BLK_NOT_FOUND;
        }

        return handle->curblock * real_blocksize + offset;

    } else { // insufficient space to fit entire document into current block
        bid_t begin, end, i, startpos;
        bid_t *block_list, block_list_size = 0;
        uint16_t *bmp_revnum_list;
        uint32_t nblock = size / blocksize;
        uint32_t remain = size % blocksize;
        uint64_t remainsize = size;
        fdb_status fs = FDB_RESULT_SUCCESS;

        // as blocks may not be consecutive, we need to maintain
        // the list of BIDs.
        block_list = (bid_t *)alca(bid_t, nblock+1);
        bmp_revnum_list = (uint16_t *)alca(uint16_t, nblock+1);

#ifdef DOCIO_BLOCK_ALIGN
        offset = blocksize - handle->curpos;
        if (remain <= blocksize - handle->curpos &&
            filemgr_alloc_multiple_cond(handle->file, handle->curblock+1,
                                        nblock + ((remain>offset)?1:0), &begin, &end,
                                        log_callback) == handle->curblock+1) {

            // start from current block
            if (begin != (handle->curblock + 1)) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in allocating blocks starting from block id %" _F64
                        " in a database file '%s'", handle->curblock + 1,
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }

            fs = _add_blk_marker(handle->file, handle->curblock, blocksize,
                                 marker, log_callback);
            if (fs != FDB_RESULT_SUCCESS) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in appending a doc block marker for a block id %" _F64
                        " into a database file '%s'", handle->curblock,
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }
            if (offset > 0) {
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          handle->curpos, offset, buf,
                                          true, // mark block as immutable
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing a doc block with id %" _F64 ", offset %d, "
                            "size %" _F64 " to a database file '%s'", handle->curblock,
                            offset, size, handle->file->filename);
                    return BLK_NOT_FOUND;
                }
            }
            remainsize -= offset;

            startpos = handle->curblock * real_blocksize + handle->curpos;
        } else {
            // next block to be allocated is not continuous .. allocate new multiple blocks
            filemgr_alloc_multiple(handle->file, nblock+((remain>0)?1:0),
                                   &begin, &end, log_callback);
            offset = 0;

            startpos = begin * real_blocksize;
        }

#else
        // Simple append mode
        // The given doc is appended at the byte offset right next the last doc.
        // Note that block allocation can be non-consecutive.
        offset = blocksize - handle->curpos;

        if (non_consecutive) {
            // new version: support non-consecutive allocation

            bool new_block = false;
            bool start_from_new_block = false;

            if (remain > offset) {
                // if the current block cannot accommodate the remaining length
                // of the document, allocate an additional block.
                new_block = true;
            }

            block_list_size = nblock + ((new_block)?1:0);
            for (i=0; i<block_list_size; ++i) {
                bmp_revnum_list[i] = filemgr_get_sb_bmp_revnum(handle->file) &
                                     BMP_REVNUM_MASK;
                block_list[i] = filemgr_alloc(handle->file, log_callback);

                if (i == 0 && handle->curblock != BLK_NOT_FOUND &&
                    block_list[i] > handle->curblock+1) {
                    // if the first new allocated block is not consecutive
                    // from the current block, start writing document from
                    // the new block.
                    start_from_new_block = true;
                    // since we won't write into the current block,
                    // allocate one more block if necessary.
                    if (remain && !new_block) {
                        new_block = true;
                        block_list_size++;
                    }
                }
            }

            if (offset > 0 && !start_from_new_block) {
                // start from the current block

                // set next BID
                blk_meta.next_bid = _endian_encode(block_list[0]);
                // write meta
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          blocksize, sizeof(blk_meta), &blk_meta,
                                          false, log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in appending a doc block metadata for a block id %" _F64
                            " into a database file '%s'", handle->curblock,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }

                // write the front part of the doc
                if (offset > 0) {
                    fs = filemgr_write_offset(handle->file, handle->curblock,
                                              handle->curpos, offset, buf,
                                              true, // mark block as immutable
                                              log_callback);
                    if (fs != FDB_RESULT_SUCCESS) {
                        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                                "Error in writing a doc block with id %" _F64 ", offset %d, "
                                "size %" _F64 " to a database file '%s'", handle->curblock,
                                offset, size, handle->file->filename);
                        return BLK_NOT_FOUND;
                    }
                }
                remainsize -= offset;

                startpos = handle->curblock * real_blocksize + handle->curpos;
            } else {
                // mark remaining space in the current block as stale
                if (handle->curblock != BLK_NOT_FOUND &&
                    handle->curpos < real_blocksize) {
                    filemgr_mark_stale(handle->file,
                                       real_blocksize * handle->curblock + handle->curpos,
                                       blocksize - handle->curpos);
                }
                offset = 0;
                startpos = block_list[0] * real_blocksize;
            }

        } else {
            // old version: consecutive allocation only

            if (filemgr_alloc_multiple_cond(handle->file, handle->curblock+1,
                                            nblock + ((remain>offset)?1:0), &begin, &end,
                                            log_callback) == handle->curblock+1) {
                // start from current block
                if (begin != (handle->curblock + 1)) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in allocating blocks starting from block id %" _F64
                            " in a database file '%s'", handle->curblock + 1,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }

                fs = _add_blk_marker(handle->file, handle->curblock, blocksize,
                                     marker, log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in appending a doc block marker for a block id %" _F64
                            " into a database file '%s'", handle->curblock,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                if (offset > 0) {
                    fs = filemgr_write_offset(handle->file, handle->curblock,
                                              handle->curpos, offset, buf,
                                              true, // mark block as immutable
                                              log_callback);
                    if (fs != FDB_RESULT_SUCCESS) {
                        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                                "Error in writing a doc block with id %" _F64 ", offset %d, "
                                "size %" _F64 " to a database file '%s'", handle->curblock,
                                offset, size, handle->file->filename);
                        return BLK_NOT_FOUND;
                    }
                }
                remainsize -= offset;

                startpos = handle->curblock * real_blocksize + handle->curpos;
            } else {
                // next block to be allocated is not continuous
                // mark remaining space in the old block as stale
                if (handle->curblock != BLK_NOT_FOUND &&
                    handle->curpos < real_blocksize) {
                    filemgr_mark_stale(handle->file,
                                       real_blocksize * handle->curblock + handle->curpos,
                                       blocksize - handle->curpos);
                }
                // allocate new multiple blocks
                filemgr_alloc_multiple(handle->file, nblock+((remain>0)?1:0),
                                       &begin, &end, log_callback);
                offset = 0;

                startpos = begin * real_blocksize;
            }

            block_list_size = end - begin + 1;
            for (i=0; i<block_list_size; ++i) {
                block_list[i] = begin+i;
            }

        } // if (non_consecutive)

#endif

        for (i=0; i<block_list_size; ++i) {
            handle->curblock = block_list[i];
            handle->cur_bmp_revnum_hash = bmp_revnum_list[i];
            blk_meta.sb_bmp_revnum_hash = _endian_encode(handle->cur_bmp_revnum_hash);

            if (non_consecutive) {
                if (i < block_list_size - 1) {
                    blk_meta.next_bid = _endian_encode(block_list[i+1]);
                } else {
                    // the last block .. set next BID '0xffff...'
                    memset(&blk_meta.next_bid, 0xff, sizeof(blk_meta.next_bid));
                }
            }

            // write meta (new) or block marker (old)
            if (non_consecutive) {
                fs = filemgr_write_offset(handle->file, handle->curblock,
                                          blocksize, sizeof(blk_meta), &blk_meta,
                                          false, log_callback);
            } else {
                fs = _add_blk_marker(handle->file, block_list[i], blocksize, marker,
                                     log_callback);
            }
            if (fs != FDB_RESULT_SUCCESS) {
                fdb_log(log_callback, FDB_LOG_ERROR, fs,
                        "Error in appending a doc block marker for a block "
                        "id %" _F64 " into a database file '%s'", block_list[i],
                        handle->file->filename);
                return BLK_NOT_FOUND;
            }

            if (remainsize >= blocksize) {
                // write entire block

                fs = filemgr_write_offset(handle->file, block_list[i], 0, blocksize,
                                          (uint8_t *)buf + offset,
                                          true, // mark block as immutable
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing an entire doc block with id %" _F64
                            ", size %" _F64 " to a database file '%s'", block_list[i], blocksize,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                offset += blocksize;
                remainsize -= blocksize;
                handle->curpos = blocksize;

            } else {
                // write rest of document
                fdb_assert(i==block_list_size-1, i, block_list_size-1);

                fs = filemgr_write_offset(handle->file, block_list[i], 0, remainsize,
                                          (uint8_t *)buf + offset,
                                          (remainsize == blocksize),
                                          log_callback);
                if (fs != FDB_RESULT_SUCCESS) {
                    fdb_log(log_callback, FDB_LOG_ERROR, fs,
                            "Error in writing a doc block with id %" _F64 ", "
                            "size %" _F64 " to a database file '%s'", block_list[i], remainsize,
                            handle->file->filename);
                    return BLK_NOT_FOUND;
                }
                offset += remainsize;
                handle->curpos = remainsize;

                if (_docio_fill_zero(handle, block_list[i], handle->curpos) !=
                    FDB_RESULT_SUCCESS) {
                    return BLK_NOT_FOUND;
                }
            }
        }

        return startpos;
    }

    return 0;
}